

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

void __thiscall
QCommandLineParserPrivate::~QCommandLineParserPrivate(QCommandLineParserPrivate *this)

{
  Data *pDVar1;
  
  QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>::~QArrayDataPointer
            (&(this->positionalArgumentDefinitions).d);
  pDVar1 = (this->description).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->description).d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->unknownOptionNames).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->positionalArgumentList).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->optionNames).d);
  QHash<long_long,_QList<QString>_>::~QHash(&this->optionValuesHash);
  QHash<QString,_long_long>::~QHash(&this->nameHash);
  QArrayDataPointer<QCommandLineOption>::~QArrayDataPointer(&(this->commandLineOptionList).d);
  pDVar1 = (this->errorText).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> +
         -1);
    UNLOCK();
    if ((__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0)
    {
      QArrayData::deallocate(&((this->errorText).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

inline QCommandLineParserPrivate()
        : singleDashWordOptionMode(QCommandLineParser::ParseAsCompactedShortOptions),
          optionsAfterPositionalArgumentsMode(QCommandLineParser::ParseAsOptions),
          builtinVersionOption(false),
          builtinHelpOption(false),
          needsParsing(true)
    { }